

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

LinkClosure * __thiscall cmGeneratorTarget::GetLinkClosure(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>,_bool>
  pVar3;
  string key;
  LinkClosure lc;
  value_type entry;
  string local_d8;
  LinkClosure local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
  local_80;
  
  cmsys::SystemTools::UpperCase(&local_d8,config);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>_>
          ::find(&(this->LinkClosureMap)._M_t,&local_d8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header
     ) {
    paVar1 = &local_b8.LinkerLanguage.field_2;
    local_b8.LinkerLanguage._M_string_length = 0;
    local_b8.LinkerLanguage.field_2._M_local_buf[0] = '\0';
    local_b8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.LinkerLanguage._M_dataplus._M_p = (pointer)paVar1;
    ComputeLinkClosure(this,config,&local_b8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::LinkClosure_&,_true>
              (&local_80,&local_d8,&local_b8);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::LinkClosure>>>
                        *)&this->LinkClosureMap,&local_80);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80.second.Languages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.second.LinkerLanguage._M_dataplus._M_p !=
        &local_80.second.LinkerLanguage.field_2) {
      operator_delete(local_80.second.LinkerLanguage._M_dataplus._M_p,
                      local_80.second.LinkerLanguage.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
      operator_delete(local_80.first._M_dataplus._M_p,
                      local_80.first.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8.Languages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.LinkerLanguage._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.LinkerLanguage._M_dataplus._M_p,
                      CONCAT71(local_b8.LinkerLanguage.field_2._M_allocated_capacity._1_7_,
                               local_b8.LinkerLanguage.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return (LinkClosure *)(iVar2._M_node + 2);
}

Assistant:

cmGeneratorTarget::LinkClosure const* cmGeneratorTarget::GetLinkClosure(
  const std::string& config) const
{
  std::string key(cmSystemTools::UpperCase(config));
  LinkClosureMapType::iterator i = this->LinkClosureMap.find(key);
  if (i == this->LinkClosureMap.end()) {
    LinkClosure lc;
    this->ComputeLinkClosure(config, lc);
    LinkClosureMapType::value_type entry(key, lc);
    i = this->LinkClosureMap.insert(entry).first;
  }
  return &i->second;
}